

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lexer.cpp
# Opt level: O1

expected<Miss2Identifier,_Miss2Identifier::Error> *
Miss2Identifier::match
          (expected<Miss2Identifier,_Miss2Identifier::Error> *__return_storage_ptr__,
          string_view *value,Options *options)

{
  long lVar1;
  char cVar2;
  int iVar3;
  char *__nptr;
  value_type *pvVar4;
  bool bVar5;
  int *piVar6;
  size_type sVar7;
  size_type sVar8;
  uint uVar9;
  long lVar10;
  bool bVar11;
  bool bVar12;
  basic_string_view<char,_std::char_traits<char>_> bVar13;
  anon_union_16_3_1618c560_for__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>,_true>_3
  aVar14;
  undefined1 auVar15 [12];
  char *local_80;
  size_type sStack_78;
  char local_70;
  undefined7 uStack_6f;
  _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>
  local_68;
  value_type *local_50;
  anon_union_16_3_1618c560_for__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>,_true>_3
  local_48;
  undefined8 local_38;
  
  bVar5 = is_identifier(value,options);
  if (bVar5) {
    if (value->__size != 0) {
      bVar11 = true;
      bVar5 = true;
      sVar7 = 0xffffffffffffffff;
      lVar10 = 1;
      sVar8 = 0;
      do {
        cVar2 = value->__data[sVar8];
        if (cVar2 == '[') {
          bVar12 = sVar7 != 0xffffffffffffffff;
          sVar7 = sVar8;
          if (bVar12) {
            __return_storage_ptr__->has_value = false;
            (__return_storage_ptr__->contained).m_error = NestingOfArrays;
            return __return_storage_ptr__;
          }
        }
        else {
          if (cVar2 == ']') {
            bVar13 = libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::substr
                               (value,0,sVar7);
            aVar14._tail.field_0 =
                 (_union<eggs::variants::detail::pack<unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>,_true>
                  )libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::substr
                             (value,sVar7 + 1,-(lVar10 + sVar7));
            if (!bVar5) {
              local_38 = 2;
              local_80 = bVar13.__data;
              local_48._tail.field_0 = aVar14._tail.field_0;
LAB_0019578c:
              local_70 = '\x01';
              sStack_78 = bVar13.__size;
              eggs::variants::detail::
              _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>
              ::_storage(&local_68,
                         (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>
                          *)&local_48._tail);
              __return_storage_ptr__->has_value = true;
              (__return_storage_ptr__->contained).m_value.identifier.__data = local_80;
              (__return_storage_ptr__->contained).m_value.identifier.__size = sStack_78;
              (__return_storage_ptr__->contained).m_value.index.
              super_OptionalBase<eggs::variants::variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char>_>_>
              .init_ = false;
              (__return_storage_ptr__->contained).m_value.index.
              super_OptionalBase<eggs::variants::variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char>_>_>
              .storage_.dummy_ = '\0';
              if (local_70 != '\x01') {
                return __return_storage_ptr__;
              }
              eggs::variants::detail::
              _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>
              ::_storage(&(__return_storage_ptr__->contained).m_value.index.
                          super_OptionalBase<eggs::variants::variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char>_>_>
                          .storage_.value_._storage,&local_68);
              (__return_storage_ptr__->contained).m_value.index.
              super_OptionalBase<eggs::variants::variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char>_>_>
              .init_ = true;
              return __return_storage_ptr__;
            }
            local_80 = &local_70;
            local_50 = bVar13.__data;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_80,aVar14._0_8_,aVar14._0_8_ + aVar14._8_8_);
            __nptr = local_80;
            piVar6 = __errno_location();
            iVar3 = *piVar6;
            *piVar6 = 0;
            lVar10 = strtol(__nptr,(char **)&local_48,10);
            pvVar4 = local_50;
            if ((char *)local_48._0_8_ == __nptr) {
              std::__throw_invalid_argument("stoi");
            }
            else {
              uVar9 = (uint)lVar10;
              if (((int)uVar9 == lVar10) && (*piVar6 != 0x22)) {
                if (*piVar6 == 0) {
                  *piVar6 = iVar3;
                }
                if (local_80 != &local_70) {
                  operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
                }
                if ((int)uVar9 < 0) {
                  __return_storage_ptr__->has_value = false;
                  (__return_storage_ptr__->contained).m_error = NegativeIndex;
                  return __return_storage_ptr__;
                }
                local_80 = pvVar4;
                local_48._4_4_ = 0;
                local_48._0_4_ = uVar9 & 0x7fffffff;
                local_38 = 1;
                goto LAB_0019578c;
              }
            }
            auVar15 = std::__throw_out_of_range("stoi");
            if (auVar15._8_4_ == 1) {
              __cxa_begin_catch();
              __return_storage_ptr__->has_value = false;
              (__return_storage_ptr__->contained).m_error = OutOfRange;
              __cxa_end_catch();
              return __return_storage_ptr__;
            }
            _Unwind_Resume(auVar15._0_8_);
          }
          if (sVar7 == 0xffffffffffffffff) {
            sVar7 = 0xffffffffffffffff;
          }
          else if ((9 < (byte)(cVar2 - 0x30U)) && (bVar5 = bVar11, cVar2 != '-')) {
            bVar5 = false;
            bVar11 = bVar5;
          }
        }
        sVar8 = sVar8 + 1;
        lVar1 = value->__size + lVar10;
        lVar10 = lVar10 + -1;
      } while (lVar1 != 2);
    }
    sVar7 = value->__size;
    (__return_storage_ptr__->contained).m_value.identifier.__data = value->__data;
    (__return_storage_ptr__->contained).m_value.identifier.__size = sVar7;
    __return_storage_ptr__->has_value = true;
    (__return_storage_ptr__->contained).m_value.index.
    super_OptionalBase<eggs::variants::variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char>_>_>
    .init_ = false;
    (__return_storage_ptr__->contained).m_value.index.
    super_OptionalBase<eggs::variants::variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char>_>_>
    .storage_.dummy_ = '\0';
  }
  else {
    __return_storage_ptr__->has_value = false;
    (__return_storage_ptr__->contained).m_error = InvalidIdentifier;
  }
  return __return_storage_ptr__;
}

Assistant:

auto Miss2Identifier::match(const string_view& value, const Options& options) -> expected<Miss2Identifier, Error>
{
    size_t begin_index = std::string::npos;
    bool is_number_index = true;

    if(!Miss2Identifier::is_identifier(value, options))
        return make_unexpected(Miss2Identifier::InvalidIdentifier);

    for(size_t i = 0; i < value.size(); ++i)
    {
        if(value[i] == '[')
        {
            if(begin_index != std::string::npos)
                return make_unexpected(Miss2Identifier::NestingOfArrays);

            begin_index = i;
        }
        else if(value[i] == ']')
        {
            auto ident = value.substr(0, begin_index);
            auto index = value.substr(begin_index + 1, i - (begin_index + 1));
            try
            {
                using index_type = decltype(Miss2Identifier::index);
                if(is_number_index)
                {
                    int index_value = std::stoi(index.to_string());
                    if(index_value >= 0)
                        return Miss2Identifier{ ident, index_type(index_value) };
                    else
                        return make_unexpected(Miss2Identifier::NegativeIndex);
                }
                else
                    return Miss2Identifier{ ident, index_type(index) };
            }
            catch(const std::out_of_range&)
            {
                return make_unexpected(Miss2Identifier::OutOfRange);
            }
        }
        else if(begin_index != std::string::npos)
        {
            if(!((value[i] >= '0' && value[i] <= '9') || (value[i] == '-')))
                is_number_index = false;
        }
    }

    return Miss2Identifier{ value, nullopt };
}